

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void transaction_simple_api_test(void)

{
  void *pvVar1;
  fdb_kvs_handle *pfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  char *__format;
  void *value;
  size_t valuelen;
  fdb_kvs_handle *db;
  fdb_kvs_handle *db_txn2;
  fdb_kvs_handle *db_txn1;
  fdb_file_handle *dbfile_txn2;
  fdb_file_handle *dbfile_txn1;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char bodybuf [256];
  char keybuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.purging_interval = 0;
  fconfig.compaction_threshold = '\0';
  fdb_open(&dbfile,"./mvcc_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar3 = fdb_set_log_callback(db,logCallbackFunc,"transaction_simple_api_test");
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xd3f);
    transaction_simple_api_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xd3f,"void transaction_simple_api_test()");
  }
  uVar7 = 0;
  while (uVar7 != 10) {
    sprintf(keybuf,"key%d",(ulong)uVar7);
    sprintf(bodybuf,"body%d",(ulong)uVar7);
    pfVar2 = db;
    sVar5 = strlen(keybuf);
    sVar6 = strlen(bodybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
    uVar7 = uVar7 + 1;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd46);
      transaction_simple_api_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xd46,"void transaction_simple_api_test()");
    }
  }
  fdb_commit(dbfile,'\0');
  fdb_open(&dbfile_txn1,"./mvcc_test1",&fconfig);
  fdb_open(&dbfile_txn2,"./mvcc_test1",&fconfig);
  fdb_kvs_open_default(dbfile_txn1,&db_txn1,&kvs_config);
  fdb_kvs_open_default(dbfile_txn2,&db_txn2,&kvs_config);
  fdb_begin_transaction(dbfile_txn1,'\x02');
  fdb_begin_transaction(dbfile_txn2,'\x02');
  for (uVar7 = 0; uVar7 != 10; uVar7 = uVar7 + 1) {
    sprintf(keybuf,"key%d",(ulong)uVar7);
    sprintf(bodybuf,"body%d_txn1",(ulong)uVar7);
    pfVar2 = db_txn1;
    sVar5 = strlen(keybuf);
    sVar6 = strlen(bodybuf);
    fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
    sprintf(keybuf,"key%d",(ulong)uVar7);
    sprintf(bodybuf,"body%d_txn2",(ulong)uVar7);
    pfVar2 = db_txn2;
    sVar5 = strlen(keybuf);
    sVar6 = strlen(bodybuf);
    fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
  }
  uVar7 = 0;
  while( true ) {
    if (uVar7 == 10) {
      fdb_end_transaction(dbfile_txn1,'\0');
      uVar7 = 0;
      while( true ) {
        if (uVar7 == 10) {
          fdb_end_transaction(dbfile_txn2,'\0');
          uVar7 = 0;
          while( true ) {
            if (uVar7 == 10) {
              fdb_close(dbfile);
              fdb_close(dbfile_txn1);
              fdb_close(dbfile_txn2);
              fdb_shutdown();
              memleak_end();
              __format = "%s PASSED\n";
              if (transaction_simple_api_test()::__test_pass != '\0') {
                __format = "%s FAILED\n";
              }
              fprintf(_stderr,__format,"transaction simple API test");
              return;
            }
            sprintf(keybuf,"key%d",(ulong)uVar7);
            sprintf(bodybuf,"body%d_txn2",(ulong)uVar7);
            pfVar2 = db;
            sVar5 = strlen(keybuf);
            fVar3 = fdb_get_kv(pfVar2,keybuf,sVar5,&value,&valuelen);
            pvVar1 = value;
            if (fVar3 != FDB_RESULT_SUCCESS) break;
            iVar4 = bcmp(value,bodybuf,valuelen);
            if (iVar4 != 0) {
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xd97);
              transaction_simple_api_test()::__test_pass = 1;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0xd97,"void transaction_simple_api_test()");
            }
            fdb_free_block(pvVar1);
            uVar7 = uVar7 + 1;
          }
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xd96);
          transaction_simple_api_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xd96,"void transaction_simple_api_test()");
        }
        sprintf(keybuf,"key%d",(ulong)uVar7);
        sprintf(bodybuf,"body%d_txn1",(ulong)uVar7);
        pfVar2 = db;
        sVar5 = strlen(keybuf);
        fVar3 = fdb_get_kv(pfVar2,keybuf,sVar5,&value,&valuelen);
        pvVar1 = value;
        if (fVar3 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xd81);
          transaction_simple_api_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xd81,"void transaction_simple_api_test()");
        }
        iVar4 = bcmp(value,bodybuf,valuelen);
        if (iVar4 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xd82);
          transaction_simple_api_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xd82,"void transaction_simple_api_test()");
        }
        fVar3 = fdb_free_block(pvVar1);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(keybuf,"key%d",(ulong)uVar7);
        sprintf(bodybuf,"body%d_txn2",(ulong)uVar7);
        pfVar2 = db_txn2;
        sVar5 = strlen(keybuf);
        fVar3 = fdb_get_kv(pfVar2,keybuf,sVar5,&value,&valuelen);
        pvVar1 = value;
        if (fVar3 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xd8a);
          transaction_simple_api_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xd8a,"void transaction_simple_api_test()");
        }
        iVar4 = bcmp(value,bodybuf,valuelen);
        if (iVar4 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xd8b);
          transaction_simple_api_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xd8b,"void transaction_simple_api_test()");
        }
        fdb_free_block(pvVar1);
        uVar7 = uVar7 + 1;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd84);
      transaction_simple_api_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xd84,"void transaction_simple_api_test()");
    }
    sprintf(keybuf,"key%d",(ulong)uVar7);
    sprintf(bodybuf,"body%d",(ulong)uVar7);
    pfVar2 = db;
    sVar5 = strlen(keybuf);
    fVar3 = fdb_get_kv(pfVar2,keybuf,sVar5,&value,&valuelen);
    pvVar1 = value;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd65);
      transaction_simple_api_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xd65,"void transaction_simple_api_test()");
    }
    iVar4 = bcmp(value,bodybuf,valuelen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd66);
      transaction_simple_api_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xd66,"void transaction_simple_api_test()");
    }
    fdb_free_block(pvVar1);
    sprintf(keybuf,"key%d",(ulong)uVar7);
    sprintf(bodybuf,"body%d_txn1",(ulong)uVar7);
    pfVar2 = db_txn1;
    sVar5 = strlen(keybuf);
    fVar3 = fdb_get_kv(pfVar2,keybuf,sVar5,&value,&valuelen);
    pvVar1 = value;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd6d);
      transaction_simple_api_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xd6d,"void transaction_simple_api_test()");
    }
    iVar4 = bcmp(value,bodybuf,valuelen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd6e);
      transaction_simple_api_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xd6e,"void transaction_simple_api_test()");
    }
    fdb_free_block(pvVar1);
    sprintf(keybuf,"key%d",(ulong)uVar7);
    sprintf(bodybuf,"body%d_txn2",(ulong)uVar7);
    pfVar2 = db_txn2;
    sVar5 = strlen(keybuf);
    fVar3 = fdb_get_kv(pfVar2,keybuf,sVar5,&value,&valuelen);
    pvVar1 = value;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xd75);
      transaction_simple_api_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xd75,"void transaction_simple_api_test()");
    }
    iVar4 = bcmp(value,bodybuf,valuelen);
    if (iVar4 != 0) break;
    fdb_free_block(pvVar1);
    uVar7 = uVar7 + 1;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xd76);
  transaction_simple_api_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xd76,"void transaction_simple_api_test()");
}

Assistant:

void transaction_simple_api_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    size_t valuelen;
    void *value;
    fdb_file_handle *dbfile, *dbfile_txn1, *dbfile_txn2;
    fdb_kvs_handle *db, *db_txn1, *db_txn2;
    fdb_status status;

    char keybuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_simple_api_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // open db and begin transactions
    fdb_open(&dbfile_txn1, "./mvcc_test1", &fconfig);
    fdb_open(&dbfile_txn2, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);

    // concurrently update docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        fdb_set_kv(db_txn1, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));

        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn2", i);
        fdb_set_kv(db_txn2, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
    }

    // retrieve key-value pairs
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);

        // txn1
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        status = fdb_get_kv(db_txn1, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);

        // txn2
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn2", i);
        status = fdb_get_kv(db_txn2, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);
    }

    // commit txn1
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        status = fdb_free_block(value);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // txn2
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn2", i);
        status = fdb_get_kv(db_txn2, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);
    }

    // commit txn2
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn2", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);
    }

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("transaction simple API test");
}